

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::pumpToNoAbort(WebSocketPipeImpl *this,WebSocket *other)

{
  bool bVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  undefined8 *puVar2;
  Coroutine<void> *this_00;
  WebSocket *pWVar3;
  _func_int *p_Var4;
  Promise<void> *promise;
  Promise<void> *pPVar5;
  __int_64 *p_Var6;
  long *plVar7;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  kj *this_01;
  __int_64 in_RDX;
  void *pvVar8;
  void *in_stack_fffffffffffff860;
  undefined1 local_2d0 [696];
  WebSocket *other_local;
  WebSocketPipeImpl *this_local;
  
  local_2d0._688_8_ = in_RDX;
  other_local = other;
  this_local = this;
  puVar2 = (undefined8 *)operator_new(0x628);
  *puVar2 = pumpToNoAbort;
  puVar2[1] = pumpToNoAbort;
  p_Var6 = puVar2 + 0xbc;
  plVar7 = puVar2 + 0xbe;
  __return_storage_ptr__ = (PromiseAwaiter<void> *)(puVar2 + 0x47);
  pPVar5 = (Promise<void> *)(puVar2 + 0xc1);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)(puVar2 + 0x7e);
  this_01 = (kj *)(puVar2 + 0xc2);
  this_00 = (Coroutine<void> *)(puVar2 + 2);
  puVar2[0xc3] = other;
  *p_Var6 = local_2d0._688_8_;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar2 + 0xb9),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"pumpToNoAbort",0xf55,0x15);
  pvVar8 = (void *)puVar2[0xbb];
  kj::_::Coroutine<void>::Coroutine(this_00,*(SourceLocation *)(puVar2 + 0xb9));
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar2 + 0x625));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar2 + 0x625));
    pWVar3 = kj::_::readMaybe<kj::WebSocket>((Maybe<kj::WebSocket_&> *)(puVar2[0xc3] + 0x28));
    *plVar7 = (long)pWVar3;
    if (*plVar7 == 0) {
      newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedPumpTo,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::WebSocket&>
                (this_01,(WebSocketPipeImpl *)puVar2[0xc3],(WebSocket *)*p_Var6);
      pPVar5 = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>
                         (this_00,(Promise<void> *)this_01);
      co_await<void>(__return_storage_ptr___00,pPVar5);
      bVar1 = kj::_::PromiseAwaiterBase::await_ready
                        ((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar1) {
        *(undefined1 *)((long)puVar2 + 0x624) = 2;
        _GLOBAL__N_1::WebSocketPipeImpl::pumpToNoAbort(in_stack_fffffffffffff860,pvVar8);
        if ((extraout_AL_00 & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
      Promise<void>::~Promise((Promise<void> *)this_01);
    }
    else {
      puVar2[0xbf] = *plVar7;
      p_Var4 = (_func_int *)(**(code **)(*(long *)*p_Var6 + 0x50))();
      local_2d0._0_8_ = puVar2[0xc3];
      puVar2[0xc0] = p_Var4;
      local_2d0._8_8_ = *p_Var6;
      local_2d0._16_8_ = puVar2 + 0xc0;
      defer<kj::(anonymous_namespace)::WebSocketPipeImpl::pumpToNoAbort(kj::WebSocket&)::_lambda()_1_>
                ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3928:7)>
                  *)(puVar2 + 0xb5),(kj *)local_2d0,(Type *)local_2d0._0_8_);
      plVar7 = (long *)puVar2[0xbf];
      (**(code **)(*plVar7 + 0x38))(pPVar5,plVar7,*p_Var6);
      promise = kj::_::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,pPVar5);
      co_await<void>(__return_storage_ptr__,promise);
      bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
      if (!bVar1) {
        *(undefined1 *)((long)puVar2 + 0x624) = 1;
        _GLOBAL__N_1::WebSocketPipeImpl::pumpToNoAbort(in_stack_fffffffffffff860,pvVar8);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
      Promise<void>::~Promise(pPVar5);
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3928:7)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:3928:7)>
                   *)(puVar2 + 0xb5));
    }
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x626));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x626));
      kj::_::Coroutine<void>::~Coroutine(this_00);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x628);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)((long)puVar2 + 0x624) = 3;
      _GLOBAL__N_1::WebSocketPipeImpl::pumpToNoAbort(in_stack_fffffffffffff860,pvVar8);
    }
  }
  else {
    *(undefined1 *)((long)puVar2 + 0x624) = 0;
    _GLOBAL__N_1::WebSocketPipeImpl::pumpToNoAbort(in_stack_fffffffffffff860,pvVar8);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpToNoAbort(WebSocket& other) {
    KJ_IF_SOME(s, state) {
      auto before = other.receivedByteCount();
      KJ_DEFER(transferredBytes += other.receivedByteCount() - before);
      co_await s.pumpTo(other);
    } else {
      co_await newAdaptedPromise<void, BlockedPumpTo>(*this, other);
    }
  }